

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O2

void test_read_format_cpio_filename_UTF8_eucJP(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive_conflict *a;
  la_int64_t lVar5;
  archive_entry *ae;
  
  pcVar4 = setlocale(6,"ja_JP.eucJP");
  if (pcVar4 != (char *)0x0) {
    extract_reference_file("test_read_format_cpio_filename_utf8_jp.cpio");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'c',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    iVar1 = archive_read_set_options((archive *)a,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      wVar2 = archive_read_open_filename(a,"test_read_format_cpio_filename_utf8_jp.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'm',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",a);
      iVar1 = archive_read_next_header((archive *)a,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      mVar3 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'q',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(ae);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'r',anon_var_dwarf_67013 + 7,"\"\\xb4\\xc1\\xbb\\xfa.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar5 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L's',8,"8",lVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)a,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      mVar3 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'w',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(ae);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'x',anon_var_dwarf_670cd + 0xb,"\"\\xc9\\xbd.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar5 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'y',4,"4",lVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)a,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'}',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      iVar1 = archive_filter_code((archive *)a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'\x80',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a
                         );
      iVar1 = archive_format((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'\x81',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,
                          "archive_format(a)",a);
      iVar1 = archive_read_close((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'g');
      test_skipping("This system cannot convert character-set from UTF-8 to eucJP.");
    }
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'^');
  test_skipping("ja_JP.eucJP locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_filename_UTF8_eucJP)
{
	const char *refname = "test_read_format_cpio_filename_utf8_jp.cpio";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read UTF-8 filename in ja_JP.eucJP with "hdrcharset=UTF-8" option.
	 */
	if (NULL == setlocale(LC_ALL, "ja_JP.eucJP")) {
		skipping("ja_JP.eucJP locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=UTF-8")) {
		skipping("This system cannot convert character-set"
		    " from UTF-8 to eucJP.");
		goto cleanup;
	}

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xb4\xc1\xbb\xfa.txt", archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xc9\xbd.txt", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CPIO_POSIX, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}